

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void (anonymous_namespace)::
     TextRegBits<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
               (Emulator *e,u8 v,BitArg arg,BitArg args,BitArg args_1,BitArg args_2,IntArg args_3)

{
  BitArg arg_00;
  BitArg args_00;
  BitArg args_1_00;
  IntArg args_2_00;
  byte bVar1;
  u8 v_00;
  Emulator *e_00;
  bool bVar2;
  size_t sVar3;
  char *local_f8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *local_30;
  char *text;
  bool is_set;
  u8 masked;
  Emulator *pEStack_20;
  u8 v_local;
  Emulator *e_local;
  IntArg args_local;
  
  args_local.text = args_3._8_8_;
  e_local = (Emulator *)args_3.text;
  text._6_1_ = v & arg.mask;
  bVar1 = text._6_1_;
  if (((undefined1  [40])arg & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
    bVar1 = (text._6_1_ != 0 ^ 0xffU) & 1;
  }
  text._5_1_ = bVar1 != 0;
  if ((bool)text._5_1_) {
    local_f8 = arg.true_text;
  }
  else {
    local_f8 = arg.false_text;
  }
  local_30 = local_f8;
  text._7_1_ = v;
  pEStack_20 = e;
  sVar3 = strlen(local_f8);
  if (sVar3 != 0) {
    ImGui::SameLine(0.0,-1.0);
    ImGui::Text("%s",local_30);
    if ((arg.tooltip != (char *)0x0) && (bVar2 = ImGui::IsItemHovered(0), bVar2)) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  e_00 = pEStack_20;
  v_00 = text._7_1_;
  memcpy(&local_58,&args,0x28);
  memcpy(&local_80,&args_1,0x28);
  memcpy(&local_a8,&args_2,0x28);
  args_2_00._8_8_ = args_local.text;
  args_2_00.text = (char *)e_local;
  arg_00.true_text = (char *)uStack_50;
  arg_00._0_8_ = local_58;
  arg_00.false_text = (char *)local_48;
  arg_00.tooltip = (char *)uStack_40;
  arg_00._32_8_ = local_38;
  args_00.true_text = (char *)uStack_78;
  args_00._0_8_ = local_80;
  args_00.false_text = (char *)local_70;
  args_00.tooltip = (char *)uStack_68;
  args_00._32_8_ = local_60;
  args_1_00.true_text = (char *)uStack_a0;
  args_1_00._0_8_ = local_a8;
  args_1_00.false_text = (char *)local_98;
  args_1_00.tooltip = (char *)uStack_90;
  args_1_00._32_8_ = local_88;
  TextRegBits<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
            (e_00,v_00,arg_00,args_00,args_1_00,args_2_00);
  return;
}

Assistant:

void TextRegBits(Emulator* e, u8 v, BitArg arg, Args... args) {
  u8 masked = v & arg.mask;
  bool is_set = arg.invert ? !masked : masked;
  const char* text = is_set ? arg.true_text : arg.false_text;
  if (strlen(text) != 0) {
    ImGui::SameLine();
    ImGui::Text("%s", text);
    if (arg.tooltip && ImGui::IsItemHovered()) {
      ImGui::SetTooltip(arg.tooltip);
    }
  }
  TextRegBits(e, v, args...);
}